

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O2

void __thiscall
Imf_3_4::CompositeDeepScanLine::setFrameBuffer(CompositeDeepScanLine *this,FrameBuffer *fr)

{
  Data *pDVar1;
  bool bVar2;
  const_iterator cVar3;
  ConstIterator CVar4;
  ostream *poVar5;
  ArgExc *this_00;
  ConstIterator tmp;
  undefined4 local_1bc;
  string name;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->_Data->_channels,3);
  std::__cxx11::string::assign
            ((char *)(this->_Data->_channels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::assign
            ((char *)((this->_Data->_channels).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1));
  std::__cxx11::string::assign
            ((char *)((this->_Data->_channels).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2));
  std::vector<int,_std::allocator<int>_>::resize(&this->_Data->_bufferMap,0);
  cVar3._M_node = (_Base_ptr)FrameBuffer::begin(fr);
  while( true ) {
    CVar4 = FrameBuffer::end(fr);
    if ((const_iterator)cVar3._M_node == CVar4._i._M_node) {
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::operator=((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&this->_Data->_outputFrameBuffer,
                  (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)fr);
      return;
    }
    if ((cVar3._M_node[10]._M_color != _S_black) || (*(int *)&cVar3._M_node[10].field_0x4 != 1))
    break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,(char *)(cVar3._M_node + 1),(allocator<char> *)&local_1bc);
    bVar2 = std::operator==(&name,"ZBack");
    if (bVar2) {
      local_1bc = 1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                (&this->_Data->_bufferMap,(int *)&local_1bc);
    }
    else {
      bVar2 = std::operator==(&name,"Z");
      if (bVar2) {
        local_1bc = 0;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&this->_Data->_bufferMap,(int *)&local_1bc);
      }
      else {
        bVar2 = std::operator==(&name,"A");
        pDVar1 = this->_Data;
        if (bVar2) {
          local_1bc = 2;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (&pDVar1->_bufferMap,(int *)&local_1bc);
        }
        else {
          local_1bc = (undefined4)
                      ((ulong)((long)(pDVar1->_channels).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pDVar1->_channels).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (&pDVar1->_bufferMap,(int *)&local_1bc);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->_Data->_channels,&name);
        }
      }
    }
    std::__cxx11::string::~string((string *)&name);
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&name);
  poVar5 = std::operator<<((ostream *)name.field_2._M_local_buf,
                           "X and/or y subsampling factors of \"");
  poVar5 = std::operator<<(poVar5,(char *)(cVar3._M_node + 1));
  std::operator<<(poVar5,"\" channel in framebuffer are not 1");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&name);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
CompositeDeepScanLine::setFrameBuffer (const FrameBuffer& fr)
{

    //
    // count channels; build map between channels in frame buffer
    // and channels in internal buffers
    //

    _Data->_channels.resize (3);
    _Data->_channels[0] = "Z";
    _Data->_channels[1] = _Data->_zback ? "ZBack" : "Z";
    _Data->_channels[2] = "A";
    _Data->_bufferMap.resize (0);

    for (FrameBuffer::ConstIterator q = fr.begin (); q != fr.end (); q++)
    {

        //
        // Frame buffer must have xSampling and ySampling set to 1
        // (Sampling in FrameBuffers must match sampling in file,
        //  and Header::sanityCheck enforces sampling in deep files is 1)
        //

        if (q.slice ().xSampling != 1 || q.slice ().ySampling != 1)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << q.name ()
                    << "\" channel in framebuffer "
                       "are not 1");
        }

        string name (q.name ());
        if (name == "ZBack") { _Data->_bufferMap.push_back (1); }
        else if (name == "Z") { _Data->_bufferMap.push_back (0); }
        else if (name == "A") { _Data->_bufferMap.push_back (2); }
        else
        {
            _Data->_bufferMap.push_back (
                static_cast<int> (_Data->_channels.size ()));
            _Data->_channels.push_back (name);
        }
    }

    _Data->_outputFrameBuffer = fr;
}